

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool QApplicationPrivate::sendMouseEvent
               (QWidget *receiver,QMouseEvent *event,QWidget *alienWidget,QWidget *nativeWidget,
               QWidget **buttonDown,QPointer<QWidget> *lastMouseReceiver,bool spontaneous,
               bool onlyDispatchEnterLeave)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  bool bVar6;
  char cVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  uint uVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  QWidget *pQVar14;
  QWidget *pQVar15;
  Data *pDVar16;
  ulong uVar17;
  QPoint QVar18;
  QObject *pQVar19;
  QWidget *pQVar20;
  ulong uVar21;
  Data *pDVar22;
  long in_FS_OFFSET;
  bool bVar23;
  double extraout_XMM0_Qa;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar28;
  double extraout_XMM1_Qa;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int *local_98;
  QWidget *local_90;
  undefined1 local_68 [16];
  QPointF local_58;
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((alienWidget != (QWidget *)0x0) &&
     (((alienWidget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    alienWidget = (QWidget *)0x0;
  }
  if (receiver == (QWidget *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&receiver->super_QObject);
  }
  if (nativeWidget == (QWidget *)0x0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&nativeWidget->super_QObject);
  }
  if (alienWidget == (QWidget *)0x0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&alienWidget->super_QObject);
  }
  pQVar14 = QApplication::activePopupWidget();
  if (pQVar14 == (QWidget *)0x0) {
    local_98 = (int *)0x0;
  }
  else {
    local_98 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar14->super_QObject);
  }
  bVar6 = QWidget::testAttribute_helper(nativeWidget,WA_DontShowOnScreen);
  pQVar5 = receiver->data;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  uVar1 = (pQVar5->crect).x2;
  uVar3 = (pQVar5->crect).y2;
  uVar2 = (pQVar5->crect).x1;
  uVar4 = (pQVar5->crect).y1;
  iVar28 = uVar1 - uVar2;
  auVar26._4_4_ = uVar3 - uVar4;
  auVar26._8_4_ = auVar26._4_4_;
  auVar26._12_4_ = -(uint)(auVar26._4_4_ < 0);
  auVar27._8_4_ = 0xffffffff;
  auVar27._0_8_ = 0xffffffffffffffff;
  auVar27._12_4_ = 0xffffffff;
  local_48 = (double)(CONCAT44(-(uint)(iVar28 < 0),iVar28) + 1);
  dStack_40 = (double)(auVar26._8_8_ - auVar27._8_8_);
  local_68 = QEventPoint::position();
  cVar7 = QRectF::contains(&local_58);
  pDVar16 = leaveAfterRelease.wp.d;
  if ((((leaveAfterRelease.wp.d != (Data *)0x0) && (*(int *)(leaveAfterRelease.wp.d + 4) != 0)) &&
      (leaveAfterRelease.wp.value != (QObject *)0x0)) &&
     ((*buttonDown == (QWidget *)0x0 && (*(int *)(event + 0x44) == 0)))) {
    leaveAfterRelease.wp.d = (Data *)0x0;
    leaveAfterRelease.wp.value = (QObject *)0x0;
    if (pDVar16 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar16 = *(int *)pDVar16 + -1;
      UNLOCK();
      if (*(int *)pDVar16 == 0) {
        operator_delete(pDVar16);
      }
    }
  }
  if (*buttonDown == (QWidget *)0x0) {
    pDVar16 = (lastMouseReceiver->wp).d;
    bVar23 = true;
    if ((pDVar16 != (Data *)0x0) && (*(int *)(pDVar16 + 4) != 0)) {
      bVar23 = (lastMouseReceiver->wp).value == (QObject *)0x0;
    }
    if ((!bVar23) && (cVar7 == '\x01')) {
      if (alienWidget == (QWidget *)0x0) {
LAB_002bde52:
        if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
          pQVar19 = (QObject *)0x0;
        }
        else {
          pQVar19 = (lastMouseReceiver->wp).value;
        }
        if (pQVar19 == (QObject *)0x0) {
          bVar23 = false;
        }
        else {
          bVar23 = (*(byte *)(*(long *)(pQVar19 + 0x20) + 0xc) & 1) == 0;
        }
        if ((alienWidget != (QWidget *)0x0) || (!bVar23)) goto LAB_002bdfa9;
      }
      else {
        if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
          pQVar15 = (QWidget *)0x0;
        }
        else {
          pQVar15 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        if (pQVar15 == alienWidget) goto LAB_002bde52;
      }
      if ((local_98 == (int *)0x0) || ((pQVar14 == (QWidget *)0x0 || (local_98[1] == 0)))) {
        if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
          local_90 = (QWidget *)0x0;
        }
        else {
          local_90 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        local_58 = (QPointF)QEventPoint::globalPosition();
        pQVar15 = receiver;
      }
      else {
        pQVar15 = QWidget::mouseGrabber();
        if (pQVar15 != (QWidget *)0x0) goto LAB_002bdfa9;
        pQVar15 = alienWidget;
        if (alienWidget == (QWidget *)0x0) {
          pQVar15 = nativeWidget;
        }
        pDVar16 = (lastMouseReceiver->wp).d;
        if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
          local_90 = (QWidget *)0x0;
        }
        else {
          local_90 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        local_58 = (QPointF)QEventPoint::globalPosition();
      }
      dispatchEnterLeave(pQVar15,local_90,&local_58);
    }
  }
  else if (!bVar6) {
    pDVar16 = leaveAfterRelease.wp.d;
    if (((alienWidget != (QWidget *)0x0) || (receiver->data->winid == 0)) &&
       ((leaveAfterRelease.wp.d == (Data *)0x0 ||
        ((*(int *)(leaveAfterRelease.wp.d + 4) == 0 ||
         (leaveAfterRelease.wp.value == (QObject *)0x0)))))) {
      pQVar15 = QWidget::mouseGrabber();
      pDVar16 = leaveAfterRelease.wp.d;
      if (pQVar15 == (QWidget *)0x0) {
        pQVar15 = *buttonDown;
        if (pQVar15 == (QWidget *)0x0) {
          pDVar16 = (Data *)0x0;
        }
        else {
          pDVar16 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                      (&pQVar15->super_QObject);
        }
        pDVar22 = leaveAfterRelease.wp.d;
        leaveAfterRelease.wp.value = &pQVar15->super_QObject;
        if (leaveAfterRelease.wp.d != (Data *)0x0) {
          LOCK();
          *(int *)leaveAfterRelease.wp.d = *(int *)leaveAfterRelease.wp.d + -1;
          leaveAfterRelease.wp.d = pDVar16;
          UNLOCK();
          pDVar16 = leaveAfterRelease.wp.d;
          if (*(int *)pDVar22 == 0) {
            operator_delete(pDVar22);
            pDVar16 = leaveAfterRelease.wp.d;
          }
        }
      }
    }
    leaveAfterRelease.wp.d = pDVar16;
    if ((*(short *)(event + 8) == 3) && (*(int *)(event + 0x44) == 0)) {
      *buttonDown = (QWidget *)0x0;
    }
  }
LAB_002bdfa9:
  if ((leaveAfterRelease.wp.d == (Data *)0x0) || (*(int *)(leaveAfterRelease.wp.d + 4) == 0)) {
    bVar23 = false;
  }
  else {
    bVar23 = leaveAfterRelease.wp.value != (QObject *)0x0;
  }
  uVar8 = 1;
  if (!onlyDispatchEnterLeave) {
    if (spontaneous) {
      uVar8 = QCoreApplication::sendSpontaneousEvent(&receiver->super_QObject,(QEvent *)event);
    }
    else {
      uVar8 = QCoreApplication::sendEvent(&receiver->super_QObject,(QEvent *)event);
    }
  }
  if ((((bVar6) || (leaveAfterRelease.wp.d == (Data *)0x0)) ||
      (*(int *)(leaveAfterRelease.wp.d + 4) == 0)) ||
     (((leaveAfterRelease.wp.value == (QObject *)0x0 || (*(short *)(event + 8) != 3)) ||
      (*(int *)(event + 0x44) != 0)))) {
LAB_002be037:
    if (bVar23) goto LAB_002be174;
    if (((local_98 == (int *)0x0) || (pQVar14 == (QWidget *)0x0)) || (local_98[1] == 0)) {
      if (((piVar11 == (int *)0x0) || (receiver == (QWidget *)0x0)) || (piVar11[1] == 0)) {
        uVar9 = QEventPoint::globalPosition();
        auVar24._0_8_ =
             (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
        auVar24._8_8_ =
             (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa;
        auVar27 = minpd(_DAT_0066f5d0,auVar24);
        auVar25._8_8_ = -(ulong)(-2147483648.0 < auVar27._8_8_);
        auVar25._0_8_ = -(ulong)(-2147483648.0 < auVar27._0_8_);
        uVar10 = movmskpd(uVar9,auVar25);
        uVar21 = 0x8000000000000000;
        if ((uVar10 & 1) != 0) {
          uVar21 = (ulong)(uint)(int)auVar27._0_8_ << 0x20;
        }
        uVar17 = 0x80000000;
        if ((uVar10 & 2) != 0) {
          uVar17 = (ulong)(uint)(int)auVar27._8_8_;
        }
        local_58.xp = (qreal)(uVar17 | uVar21);
        receiver = QApplication::widgetAt((QPoint *)&local_58);
      }
      goto LAB_002be145;
    }
    pQVar14 = QWidget::mouseGrabber();
    if (pQVar14 != (QWidget *)0x0) goto LAB_002be174;
    if ((piVar13 == (int *)0x0) || (piVar13[1] == 0 || alienWidget == (QWidget *)0x0)) {
      if (piVar12 == (int *)0x0) {
        alienWidget = (QWidget *)0x0;
      }
      else {
        alienWidget = nativeWidget;
        if (piVar12[1] == 0) {
          alienWidget = (QWidget *)0x0;
        }
      }
    }
    if (alienWidget == (QWidget *)0x0) {
      pDVar16 = (Data *)0x0;
    }
    else {
      pDVar16 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                  (&alienWidget->super_QObject);
    }
    pDVar22 = (lastMouseReceiver->wp).d;
    (lastMouseReceiver->wp).d = pDVar16;
    (lastMouseReceiver->wp).value = &alienWidget->super_QObject;
  }
  else {
    pQVar15 = QWidget::mouseGrabber();
    if ((leaveAfterRelease.wp.d == (Data *)0x0) ||
       (pQVar20 = (QWidget *)leaveAfterRelease.wp.value, *(int *)(leaveAfterRelease.wp.d + 4) == 0))
    {
      pQVar20 = (QWidget *)0x0;
    }
    if (pQVar20 == pQVar15) goto LAB_002be037;
    if ((piVar12 == (int *)0x0) || (piVar12[1] == 0)) {
      local_58 = (QPointF)QEventPoint::globalPosition();
      QVar18 = QPointF::toPoint(&local_58);
      local_68._0_8_ = QVar18;
      receiver = QApplication::widgetAt((QPoint *)local_68);
    }
    else {
      receiver = nativeWidget;
      if (piVar13 != (int *)0x0) {
        if (alienWidget == (QWidget *)0x0) {
          alienWidget = nativeWidget;
        }
        if (piVar13[1] != 0) {
          receiver = alienWidget;
        }
      }
    }
    if ((leaveAfterRelease.wp.d == (Data *)0x0) ||
       (pQVar14 = (QWidget *)leaveAfterRelease.wp.value, *(int *)(leaveAfterRelease.wp.d + 4) == 0))
    {
      pQVar14 = (QWidget *)0x0;
    }
    local_58 = (QPointF)QEventPoint::globalPosition();
    dispatchEnterLeave(receiver,pQVar14,&local_58);
    pDVar16 = leaveAfterRelease.wp.d;
    leaveAfterRelease.wp.d = (Data *)0x0;
    leaveAfterRelease.wp.value = (QObject *)0x0;
    if (pDVar16 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar16 = *(int *)pDVar16 + -1;
      UNLOCK();
      if (*(int *)pDVar16 == 0) {
        operator_delete(pDVar16);
      }
    }
LAB_002be145:
    if (receiver == (QWidget *)0x0) {
      pDVar16 = (Data *)0x0;
    }
    else {
      pDVar16 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&receiver->super_QObject);
    }
    pDVar22 = (lastMouseReceiver->wp).d;
    (lastMouseReceiver->wp).d = pDVar16;
    (lastMouseReceiver->wp).value = &receiver->super_QObject;
  }
  if (pDVar22 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar22 = *(int *)pDVar22 + -1;
    UNLOCK();
    if (*(int *)pDVar22 == 0) {
      operator_delete(pDVar22);
    }
  }
LAB_002be174:
  if (local_98 != (int *)0x0) {
    LOCK();
    *local_98 = *local_98 + -1;
    UNLOCK();
    if (*local_98 == 0) {
      operator_delete(local_98);
    }
  }
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      operator_delete(piVar13);
    }
  }
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      operator_delete(piVar12);
    }
  }
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      operator_delete(piVar11);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar8;
}

Assistant:

bool QApplicationPrivate::sendMouseEvent(QWidget *receiver, QMouseEvent *event,
                                         QWidget *alienWidget, QWidget *nativeWidget,
                                         QWidget **buttonDown, QPointer<QWidget> &lastMouseReceiver,
                                         bool spontaneous, bool onlyDispatchEnterLeave)
{
    Q_ASSERT(receiver);
    Q_ASSERT(event);
    Q_ASSERT(nativeWidget);
    Q_ASSERT(buttonDown);

    if (alienWidget && !isAlien(alienWidget))
        alienWidget = nullptr;

    QPointer<QWidget> receiverGuard = receiver;
    QPointer<QWidget> nativeGuard = nativeWidget;
    QPointer<QWidget> alienGuard = alienWidget;
    QPointer<QWidget> activePopupWidget = QApplication::activePopupWidget();

    const bool graphicsWidget = nativeWidget->testAttribute(Qt::WA_DontShowOnScreen);

    bool widgetUnderMouse = QRectF(receiver->rect()).contains(event->position());

    // Clear the obsolete leaveAfterRelease value, if mouse button has been released but
    // leaveAfterRelease has not been updated.
    // This happens e.g. when modal dialog or popup is shown as a response to button click.
    if (leaveAfterRelease && !*buttonDown && !event->buttons())
        leaveAfterRelease = nullptr;

    if (*buttonDown) {
        if (!graphicsWidget) {
            // Register the widget that shall receive a leave event
            // after the last button is released.
            if ((alienWidget || !receiver->internalWinId()) && !leaveAfterRelease && !QWidget::mouseGrabber())
                leaveAfterRelease = *buttonDown;
            if (event->type() == QEvent::MouseButtonRelease && !event->buttons())
                *buttonDown = nullptr;
        }
    } else if (lastMouseReceiver && widgetUnderMouse) {
        // Dispatch enter/leave if we move:
        // 1) from an alien widget to another alien widget or
        //    from a native widget to an alien widget (first OR case)
        // 2) from an alien widget to a native widget (second OR case)
        if ((alienWidget && alienWidget != lastMouseReceiver)
            || (isAlien(lastMouseReceiver) && !alienWidget)) {
            if (activePopupWidget) {
                if (!QWidget::mouseGrabber())
                    dispatchEnterLeave(alienWidget ? alienWidget : nativeWidget, lastMouseReceiver, event->globalPosition());
            } else {
                dispatchEnterLeave(receiver, lastMouseReceiver, event->globalPosition());
            }

        }
    }

    // We need this quard in case someone opens a modal dialog / popup. If that's the case
    // leaveAfterRelease is set to null, but we shall not update lastMouseReceiver.
    const bool wasLeaveAfterRelease = leaveAfterRelease != nullptr;
    bool result = true;
    // This code is used for sending the synthetic enter/leave events for cases where it is needed
    // due to other events causing the widget under the mouse to change. However in those cases
    // we do not want to send the mouse event associated with this call, so this enables us to
    // not send the unneeded mouse event
    if (!onlyDispatchEnterLeave) {
        if (spontaneous)
            result = QApplication::sendSpontaneousEvent(receiver, event);
        else
            result = QCoreApplication::sendEvent(receiver, event);
    }

    if (!graphicsWidget && leaveAfterRelease && event->type() == QEvent::MouseButtonRelease
        && !event->buttons() && QWidget::mouseGrabber() != leaveAfterRelease) {
        // Dispatch enter/leave if:
        // 1) the mouse grabber is an alien widget
        // 2) the button is released on an alien widget
        QWidget *enter = nullptr;
        if (nativeGuard)
            enter = alienGuard ? alienWidget : nativeWidget;
        else // The receiver is typically deleted on mouse release with drag'n'drop.
            enter = QApplication::widgetAt(event->globalPosition().toPoint());
        dispatchEnterLeave(enter, leaveAfterRelease, event->globalPosition());
        leaveAfterRelease = nullptr;
        lastMouseReceiver = enter;
    } else if (!wasLeaveAfterRelease) {
        if (activePopupWidget) {
            if (!QWidget::mouseGrabber())
                lastMouseReceiver = alienGuard ? alienWidget : (nativeGuard ? nativeWidget : nullptr);
        } else {
            lastMouseReceiver = receiverGuard ? receiver : QApplication::widgetAt(event->globalPosition().toPoint());
        }
    }

    return result;
}